

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::HlslParseContext::handleSemantic
          (HlslParseContext *this,TSourceLoc loc,TQualifier *qualifier,TBuiltInVariable builtIn,
          TString *upperCase)

{
  EShLanguage EVar1;
  pointer pcVar2;
  HlslParseContext *pHVar3;
  int iVar4;
  size_type sVar5;
  uint uVar6;
  uint uVar7;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_bool>
  pVar8;
  anon_class_32_2_633b926d local_50;
  
  local_50.loc.name = loc.name;
  local_50.loc.string = loc.string;
  local_50.loc.line = loc.line;
  local_50.loc.column = loc.column;
  local_50.loc._20_4_ = loc._20_4_;
  local_50.this = this;
  if (builtIn == EbvNone) {
    if (((this->super_TParseContextBase).super_TParseVersions.messages & EShMsgHlslDX9Compatible) !=
        EShMsgDefault) {
      EVar1 = (this->super_TParseContextBase).super_TParseVersions.language;
      if (EVar1 == EShLangFragment) {
        uVar6 = *(uint *)&qualifier->field_0x8 & 0x7f;
        builtIn = EbvNone;
        if ((uVar6 < 0x14) && ((0xd0000U >> (*(uint *)&qualifier->field_0x8 & 0x1f) & 1) != 0)) {
          iVar4 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(upperCase,"VPOS");
          builtIn = EbvFragCoord;
          if (iVar4 != 0) {
            builtIn = EbvNone;
          }
          uVar6 = *(uint *)&qualifier->field_0x8 & 0x7f;
        }
        if (uVar6 - 0x11 < 2) {
          iVar4 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(upperCase,0,5,"COLOR");
          if (iVar4 == 0) {
            uVar6 = handleSemantic::anon_class_32_2_633b926d::operator()
                              (&local_50,upperCase,0,(char *)0x0);
            *(ulong *)&qualifier->field_0x1c =
                 *(ulong *)&qualifier->field_0x1c & 0xfffffffffffff000 | (ulong)(uVar6 & 0xfff);
            uVar6 = (uVar6 & 0xfff) + 1;
            if (uVar6 < this->nextOutLocation) {
              uVar6 = this->nextOutLocation;
            }
            this->nextOutLocation = uVar6;
          }
          iVar4 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(upperCase,"DEPTH");
          if (iVar4 == 0) {
            builtIn = EbvFragDepth;
            goto LAB_0041837e;
          }
        }
      }
      else {
        if ((EVar1 != EShLangVertex) || (1 < (*(uint *)&qualifier->field_0x8 & 0x7f) - 0x11))
        goto LAB_0041808e;
        iVar4 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (upperCase,"POSITION");
        builtIn = EbvPosition;
        if (iVar4 != 0) {
          builtIn = EbvNone;
        }
        iVar4 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (upperCase,"PSIZE");
        if (iVar4 == 0) {
          builtIn = EbvPointSize;
          goto LAB_0041837e;
        }
      }
      goto LAB_00417fe1;
    }
  }
  else {
LAB_00417fe1:
    if (0x37 < (int)builtIn) {
      if (builtIn - EbvTessLevelOuter < 2) {
        qualifier->field_0xd = qualifier->field_0xd | 0x10;
      }
      else if (builtIn == EbvFragStencilRef) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,&loc,"unimplemented; need ARB_shader_stencil_export","SV_STENCILREF","");
        builtIn = EbvFragStencilRef;
      }
      goto LAB_0041837e;
    }
    if (builtIn != EbvNone) {
      if ((builtIn == EbvPosition) &&
         (builtIn = EbvPosition,
         (this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment)) {
        builtIn = EbvFragCoord;
      }
      goto LAB_0041837e;
    }
  }
LAB_0041808e:
  if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment) {
    uVar6 = 0;
    iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(upperCase,0,9,"SV_TARGET");
    if (iVar4 == 0) {
      sVar5 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
              find_last_not_of(upperCase,"0123456789",0xffffffffffffffff,10);
      if (sVar5 != 0xffffffffffffffff) {
        uVar6 = atoi((upperCase->_M_dataplus)._M_p + sVar5 + 1);
        uVar6 = uVar6 & 0xfff;
      }
      *(ulong *)&qualifier->field_0x1c =
           *(ulong *)&qualifier->field_0x1c & 0xfffffffffffff000 | (ulong)uVar6;
      uVar7 = uVar6 + 1;
      if (uVar6 + 1 < this->nextOutLocation) {
        uVar7 = this->nextOutLocation;
      }
      this->nextOutLocation = uVar7;
      builtIn = EbvNone;
      goto LAB_0041837e;
    }
  }
  builtIn = EbvNone;
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(upperCase,0,0xf,"SV_CLIPDISTANCE");
  pHVar3 = local_50.this;
  if (iVar4 == 0) {
    sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::find_last_not_of(upperCase,"0123456789",0xffffffffffffffff,10);
    if (sVar5 == 0xffffffffffffffff) {
      uVar6 = 0;
    }
    else {
      pcVar2 = (upperCase->_M_dataplus)._M_p;
      uVar6 = atoi(pcVar2 + sVar5 + 1);
      if (1 < uVar6) {
        uVar6 = 0;
        (*(pHVar3->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (pHVar3,&local_50.loc,"invalid clip semantic",pcVar2,"");
      }
    }
    *(ulong *)&qualifier->field_0x1c =
         *(ulong *)&qualifier->field_0x1c & 0xfffffffffffff000 | (ulong)uVar6;
    builtIn = EbvClipDistance;
  }
  else {
    iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(upperCase,0,0xf,"SV_CULLDISTANCE");
    pHVar3 = local_50.this;
    if (iVar4 == 0) {
      sVar5 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
              find_last_not_of(upperCase,"0123456789",0xffffffffffffffff,10);
      if (sVar5 == 0xffffffffffffffff) {
        uVar6 = 0;
      }
      else {
        pcVar2 = (upperCase->_M_dataplus)._M_p;
        uVar6 = atoi(pcVar2 + sVar5 + 1);
        if (1 < uVar6) {
          uVar6 = 0;
          (*(pHVar3->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (pHVar3,&local_50.loc,"invalid cull semantic",pcVar2,"");
        }
      }
      *(ulong *)&qualifier->field_0x1c =
           *(ulong *)&qualifier->field_0x1c & 0xfffffffffffff000 | (ulong)uVar6;
      builtIn = EbvCullDistance;
    }
  }
LAB_0041837e:
  if ((*(ulong *)&qualifier->field_0x8 & 0xff80) == 0) {
    *(ulong *)&qualifier->field_0x8 =
         *(ulong *)&qualifier->field_0x8 | (ulong)((builtIn & 0x1ff) << 7);
  }
  pVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::_Identity<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
          ::
          _M_insert_unique<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const&>
                    ((_Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::_Identity<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
                      *)&((this->super_TParseContextBase).super_TParseVersions.intermediate)->
                         semanticNameSet,upperCase);
  qualifier->semanticName = (char *)pVar8.first._M_node._M_node[1]._M_parent;
  return;
}

Assistant:

void HlslParseContext::handleSemantic(TSourceLoc loc, TQualifier& qualifier, TBuiltInVariable builtIn,
                                      const TString& upperCase)
{
    // Parse and return semantic number.  If limit is 0, it will be ignored.  Otherwise, if the parsed
    // semantic number is >= limit, errorMsg is issued and 0 is returned.
    // TODO: it would be nicer if limit and errorMsg had default parameters, but some compilers don't yet
    // accept those in lambda functions.
    const auto getSemanticNumber = [this, loc](const TString& semantic, unsigned int limit, const char* errorMsg) -> unsigned int {
        size_t pos = semantic.find_last_not_of("0123456789");
        if (pos == std::string::npos)
            return 0u;

        unsigned int semanticNum = (unsigned int)atoi(semantic.c_str() + pos + 1);

        if (limit != 0 && semanticNum >= limit) {
            error(loc, errorMsg, semantic.c_str(), "");
            return 0u;
        }

        return semanticNum;
    };

    if (builtIn == EbvNone && hlslDX9Compatible()) {
        if (language == EShLangVertex) {
            if (qualifier.isParamOutput()) {
                if (upperCase == "POSITION") {
                    builtIn = EbvPosition;
                }
                if (upperCase == "PSIZE") {
                    builtIn = EbvPointSize;
                }
            }
        } else if (language == EShLangFragment) {
            if (qualifier.isParamInput() && upperCase == "VPOS") {
                builtIn = EbvFragCoord;
            }
            if (qualifier.isParamOutput()) {
                if (upperCase.compare(0, 5, "COLOR") == 0) {
                    qualifier.layoutLocation = getSemanticNumber(upperCase, 0, nullptr);
                    nextOutLocation = std::max(nextOutLocation, qualifier.layoutLocation + 1u);
                }
                if (upperCase == "DEPTH") {
                    builtIn = EbvFragDepth;
                }
            }
        }
    }

    switch(builtIn) {
    case EbvNone:
        // Get location numbers from fragment outputs, instead of
        // auto-assigning them.
        if (language == EShLangFragment && upperCase.compare(0, 9, "SV_TARGET") == 0) {
            qualifier.layoutLocation = getSemanticNumber(upperCase, 0, nullptr);
            nextOutLocation = std::max(nextOutLocation, qualifier.layoutLocation + 1u);
        } else if (upperCase.compare(0, 15, "SV_CLIPDISTANCE") == 0) {
            builtIn = EbvClipDistance;
            qualifier.layoutLocation = getSemanticNumber(upperCase, maxClipCullRegs, "invalid clip semantic");
        } else if (upperCase.compare(0, 15, "SV_CULLDISTANCE") == 0) {
            builtIn = EbvCullDistance;
            qualifier.layoutLocation = getSemanticNumber(upperCase, maxClipCullRegs, "invalid cull semantic");
        }
        break;
    case EbvPosition:
        // adjust for stage in/out
        if (language == EShLangFragment)
            builtIn = EbvFragCoord;
        break;
    case EbvFragStencilRef:
        error(loc, "unimplemented; need ARB_shader_stencil_export", "SV_STENCILREF", "");
        break;
    case EbvTessLevelInner:
    case EbvTessLevelOuter:
        qualifier.patch = true;
        break;
    default:
        break;
    }

    if (qualifier.builtIn == EbvNone)
        qualifier.builtIn = builtIn;
    qualifier.semanticName = intermediate.addSemanticName(upperCase);
}